

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::createVertexInfo
               (vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>
                *vertexDesc,
               vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *bindingList,
               vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *attrList,VkPipelineVertexInputStateCreateInfo *vertexInputState)

{
  bool bVar1;
  pointer pVVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  undefined1 local_58 [8];
  VkVertexInputAttributeDescription attrDesc;
  VkVertexInputBindingDescription bindingDesc;
  deUint32 bindingId;
  __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
  local_30;
  const_iterator vertDescIter;
  VkPipelineVertexInputStateCreateInfo *vertexInputState_local;
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  *attrList_local;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  *bindingList_local;
  vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>
  *vertexDesc_local;
  
  vertDescIter._M_current = (VertexDesc *)vertexInputState;
  local_30._M_current =
       (VertexDesc *)
       std::
       vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>
       ::begin(vertexDesc);
  while( true ) {
    register0x00000000 =
         std::
         vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>
         ::end(vertexDesc);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
                        *)&bindingDesc.inputRate);
    if (!bVar1) break;
    bindingDesc.stride = 0;
    attrDesc.format = VK_FORMAT_UNDEFINED;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
             ::operator->(&local_30);
    attrDesc.offset = pVVar2->stride;
    bindingDesc.binding = 0;
    std::
    vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
    ::push_back(bindingList,(value_type *)&attrDesc.format);
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
             ::operator->(&local_30);
    local_58._0_4_ = pVVar2->location;
    local_58._4_4_ = bindingDesc.stride;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
             ::operator->(&local_30);
    attrDesc.location = pVVar2->format;
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
             ::operator->(&local_30);
    attrDesc.binding = pVVar2->offset;
    std::
    vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
    ::push_back(attrList,(value_type *)local_58);
    bindingDesc.stride = bindingDesc.stride + 1;
    __gnu_cxx::
    __normal_iterator<const_vkt::synchronization::(anonymous_namespace)::VertexDesc_*,_std::vector<vkt::synchronization::(anonymous_namespace)::VertexDesc,_std::allocator<vkt::synchronization::(anonymous_namespace)::VertexDesc>_>_>
    ::operator++(&local_30,0);
  }
  ::deMemset(vertDescIter._M_current,0xcd,0x30);
  (vertDescIter._M_current)->location = 0x13;
  (vertDescIter._M_current)->stride = 0;
  (vertDescIter._M_current)->offset = 0;
  vertDescIter._M_current[1].location = 0;
  sVar3 = std::
          vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
          ::size(bindingList);
  vertDescIter._M_current[1].format = (VkFormat)sVar3;
  pvVar4 = std::
           vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ::operator[](bindingList,0);
  *(reference *)&vertDescIter._M_current[1].stride = pvVar4;
  sVar3 = std::
          vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ::size(attrList);
  vertDescIter._M_current[2].location = (deUint32)sVar3;
  pvVar5 = std::
           vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ::operator[](attrList,0);
  *(reference *)&vertDescIter._M_current[2].stride = pvVar5;
  return;
}

Assistant:

void createVertexInfo (const vector<VertexDesc>& vertexDesc, vector<VkVertexInputBindingDescription>& bindingList, vector<VkVertexInputAttributeDescription>& attrList, VkPipelineVertexInputStateCreateInfo& vertexInputState)
{
	for (vector<VertexDesc>::const_iterator vertDescIter = vertexDesc.begin(); vertDescIter != vertexDesc.end(); vertDescIter++)
	{
		deUint32							bindingId = 0;
		VkVertexInputBindingDescription		bindingDesc;
		VkVertexInputAttributeDescription	attrDesc;

		bindingDesc.binding		= bindingId;
		bindingDesc.stride		= vertDescIter->stride;
		bindingDesc.inputRate	= VK_VERTEX_INPUT_RATE_VERTEX;
		bindingList.push_back(bindingDesc);

		attrDesc.location		= vertDescIter->location;
		attrDesc.binding		= bindingId;
		attrDesc.format			= vertDescIter->format;
		attrDesc.offset			= vertDescIter->offset;
		attrList.push_back(attrDesc);

		bindingId++;
	}

	deMemset(&vertexInputState, 0xcd, sizeof(vertexInputState));
	vertexInputState.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
	vertexInputState.pNext = DE_NULL;
	vertexInputState.flags = 0u;
	vertexInputState.vertexBindingDescriptionCount = (deUint32)bindingList.size();
	vertexInputState.pVertexBindingDescriptions = &bindingList[0];
	vertexInputState.vertexAttributeDescriptionCount = (deUint32)attrList.size();
	vertexInputState.pVertexAttributeDescriptions = &attrList[0];
}